

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct32x32_low16_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int in_ECX;
  int in_EDX;
  undefined8 *in_RDI;
  __m128i *in_R8;
  __m128i *palVar1;
  __m128i *in_R9;
  __m128i *palVar2;
  __m128i *extraout_XMM0_Qa;
  __m128i *extraout_XMM0_Qa_00;
  __m128i *extraout_XMM0_Qa_01;
  __m128i *extraout_XMM0_Qa_02;
  int extraout_XMM0_Dc;
  __m128i *extraout_XMM0_Qb;
  __m128i *extraout_XMM0_Qb_00;
  __m128i *extraout_XMM0_Qb_01;
  __m128i *extraout_XMM0_Qb_02;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i in1_07;
  __m128i in1_08;
  __m128i in1_09;
  __m128i in1_10;
  __m128i in1_11;
  __m128i in1_12;
  __m128i in1_13;
  __m128i in1_14;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i in0_07;
  __m128i in0_08;
  __m128i in0_09;
  __m128i in0_10;
  __m128i in0_11;
  __m128i in0_12;
  __m128i in0_13;
  __m128i in0_14;
  __m128i bf1 [32];
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i rounding;
  __m128i cospim16;
  __m128i cospi16;
  __m128i cospim48;
  __m128i cospi48;
  __m128i cospim32;
  __m128i cospi32;
  __m128i cospim24;
  __m128i cospim56;
  __m128i cospim8;
  __m128i cospim40;
  __m128i cospi8;
  __m128i cospi40;
  __m128i cospi24;
  __m128i cospi56;
  __m128i cospim36;
  __m128i cospim52;
  __m128i cospi4;
  __m128i cospi20;
  __m128i cospi12;
  __m128i cospi44;
  __m128i cospi28;
  __m128i cospi60;
  __m128i cospim34;
  __m128i cospim50;
  __m128i cospim42;
  __m128i cospim58;
  __m128i cospi2;
  __m128i cospi18;
  __m128i cospi10;
  __m128i cospi26;
  __m128i cospi6;
  __m128i cospi38;
  __m128i cospi22;
  __m128i cospi54;
  __m128i cospi14;
  __m128i cospi46;
  __m128i cospi30;
  __m128i cospi62;
  int32_t *cospi;
  __m128i *in_stack_fffffffffffff528;
  __m128i *palVar3;
  __m128i *in_stack_fffffffffffff530;
  __m128i *palVar4;
  int iVar5;
  undefined4 in_stack_fffffffffffff54c;
  undefined4 in_stack_fffffffffffff550;
  int iVar6;
  __m128i *palVar7;
  __m128i *palVar8;
  __m128i *in_stack_fffffffffffff568;
  __m128i *palVar9;
  __m128i *in_stack_fffffffffffff570;
  __m128i *bf1_00;
  __m128i *out_00;
  __m128i *clamp_hi_00;
  __m128i *in_stack_fffffffffffff588;
  __m128i *rounding_00;
  __m128i *in_stack_fffffffffffff590;
  __m128i *clamp_hi_01;
  __m128i *rounding_01;
  int bit_00;
  undefined1 local_a58 [16];
  longlong local_a48;
  longlong lStack_a40;
  undefined1 local_a38 [16];
  longlong local_a28;
  __m128i *clamp_hi_02;
  undefined1 local_a18 [16];
  longlong local_a08;
  longlong lStack_a00;
  undefined1 local_9f8 [16];
  longlong local_9e8;
  longlong lStack_9e0;
  undefined1 local_9d8 [16];
  longlong local_9c8;
  longlong lStack_9c0;
  undefined1 local_9b8 [16];
  longlong local_9a8;
  longlong lStack_9a0;
  undefined1 local_998 [16];
  longlong local_988;
  longlong lStack_980;
  undefined1 local_978 [16];
  longlong local_968;
  longlong lStack_960;
  undefined1 local_958 [16];
  longlong local_948;
  longlong lStack_940;
  undefined1 local_938 [16];
  longlong local_928;
  longlong lStack_920;
  undefined1 local_918 [16];
  longlong local_908;
  longlong lStack_900;
  undefined1 local_8f8 [16];
  longlong local_8e8;
  longlong lStack_8e0;
  undefined1 local_8d8 [16];
  longlong local_8c8;
  longlong lStack_8c0;
  undefined1 local_8b8 [16];
  longlong local_8a8;
  longlong lStack_8a0;
  longlong local_898;
  longlong lStack_890;
  int local_87c;
  longlong local_878;
  longlong lStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  longlong local_858;
  longlong lStack_850;
  longlong local_848;
  longlong lStack_840;
  longlong local_838;
  longlong lStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  longlong local_818;
  longlong lStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  longlong local_7f8;
  longlong lStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  longlong local_7d8;
  longlong lStack_7d0;
  longlong local_7c8;
  longlong lStack_7c0;
  longlong local_7b8;
  longlong lStack_7b0;
  longlong local_7a8;
  longlong lStack_7a0;
  longlong local_798;
  longlong lStack_790;
  longlong local_788;
  longlong lStack_780;
  longlong local_778;
  longlong lStack_770;
  longlong local_768;
  longlong lStack_760;
  longlong local_758;
  longlong lStack_750;
  longlong local_748;
  longlong lStack_740;
  longlong local_738;
  longlong lStack_730;
  longlong local_728;
  longlong lStack_720;
  longlong local_718;
  longlong lStack_710;
  longlong local_708;
  longlong lStack_700;
  longlong local_6f8;
  longlong lStack_6f0;
  longlong local_6e8;
  longlong lStack_6e0;
  longlong local_6d8;
  longlong lStack_6d0;
  longlong local_6c8;
  longlong lStack_6c0;
  longlong local_6b8;
  longlong lStack_6b0;
  longlong local_6a8;
  longlong lStack_6a0;
  longlong local_698;
  longlong lStack_690;
  longlong local_688;
  longlong lStack_680;
  longlong local_678;
  longlong lStack_670;
  longlong local_668;
  longlong lStack_660;
  longlong local_658;
  longlong lStack_650;
  longlong local_648;
  longlong lStack_640;
  longlong local_638;
  longlong lStack_630;
  longlong local_628;
  longlong lStack_620;
  longlong local_618;
  longlong lStack_610;
  int32_t *local_608;
  undefined4 local_600;
  int local_5fc;
  int local_5f8;
  int local_5f4;
  undefined8 *local_5e8;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  int local_5d0;
  int32_t local_5cc;
  int local_5c8;
  int32_t local_5c4;
  int local_5c0;
  int32_t local_5bc;
  int local_5b8;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  int32_t local_5a8;
  int32_t local_5a4;
  int32_t local_5a0;
  int32_t local_59c;
  int local_598;
  int local_594;
  int32_t local_590;
  int32_t local_58c;
  int32_t local_588;
  int32_t local_584;
  int32_t local_580;
  int32_t local_57c;
  int local_578;
  int local_574;
  int local_570;
  int local_56c;
  int32_t local_568;
  int32_t local_564;
  int32_t local_560;
  int32_t local_55c;
  int32_t local_558;
  int32_t local_554;
  int32_t local_550;
  int32_t local_54c;
  int32_t local_548;
  int32_t local_544;
  int32_t local_540;
  int32_t local_53c;
  longlong local_538;
  longlong lStack_530;
  int32_t local_528;
  int32_t local_524;
  int32_t local_520;
  int32_t local_51c;
  longlong local_518;
  longlong lStack_510;
  int32_t local_508;
  int32_t local_504;
  int32_t local_500;
  int32_t local_4fc;
  longlong local_4f8;
  longlong lStack_4f0;
  int32_t local_4e8;
  int32_t local_4e4;
  int32_t local_4e0;
  int32_t local_4dc;
  longlong local_4d8;
  longlong lStack_4d0;
  int32_t local_4c8;
  int32_t local_4c4;
  int32_t local_4c0;
  int32_t local_4bc;
  longlong local_4b8;
  longlong lStack_4b0;
  int32_t local_4a8;
  int32_t local_4a4;
  int32_t local_4a0;
  int32_t local_49c;
  longlong local_498;
  longlong lStack_490;
  int32_t local_488;
  int32_t local_484;
  int32_t local_480;
  int32_t local_47c;
  longlong local_478;
  longlong lStack_470;
  int32_t local_468;
  int32_t local_464;
  int32_t local_460;
  int32_t local_45c;
  longlong local_458;
  longlong lStack_450;
  int32_t local_448;
  int32_t local_444;
  int32_t local_440;
  int32_t local_43c;
  longlong local_438;
  longlong lStack_430;
  int32_t local_428;
  int32_t local_424;
  int32_t local_420;
  int32_t local_41c;
  longlong local_418;
  longlong lStack_410;
  int32_t local_408;
  int32_t local_404;
  int32_t local_400;
  int32_t local_3fc;
  longlong local_3f8;
  longlong lStack_3f0;
  int32_t local_3e8;
  int32_t local_3e4;
  int32_t local_3e0;
  int32_t local_3dc;
  longlong local_3d8;
  longlong lStack_3d0;
  int32_t local_3c8;
  int32_t local_3c4;
  int32_t local_3c0;
  int32_t local_3bc;
  longlong local_3b8;
  longlong lStack_3b0;
  int local_3a8;
  int local_3a4;
  int local_3a0;
  int local_39c;
  longlong local_398;
  longlong lStack_390;
  int local_388;
  int local_384;
  int local_380;
  int local_37c;
  longlong local_378;
  longlong lStack_370;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  longlong local_358;
  longlong lStack_350;
  int local_348;
  int local_344;
  int local_340;
  int local_33c;
  longlong local_338;
  longlong lStack_330;
  int32_t local_328;
  int32_t local_324;
  int32_t local_320;
  int32_t local_31c;
  longlong local_318;
  longlong lStack_310;
  int32_t local_308;
  int32_t local_304;
  int32_t local_300;
  int32_t local_2fc;
  longlong local_2f8;
  longlong lStack_2f0;
  int32_t local_2e8;
  int32_t local_2e4;
  int32_t local_2e0;
  int32_t local_2dc;
  longlong local_2d8;
  longlong lStack_2d0;
  int32_t local_2c8;
  int32_t local_2c4;
  int32_t local_2c0;
  int32_t local_2bc;
  longlong local_2b8;
  longlong lStack_2b0;
  int32_t local_2a8;
  int32_t local_2a4;
  int32_t local_2a0;
  int32_t local_29c;
  longlong local_298;
  longlong lStack_290;
  int32_t local_288;
  int32_t local_284;
  int32_t local_280;
  int32_t local_27c;
  longlong local_278;
  longlong lStack_270;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  longlong local_258;
  longlong lStack_250;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  longlong local_238;
  longlong lStack_230;
  int32_t local_228;
  int32_t local_224;
  int32_t local_220;
  int32_t local_21c;
  longlong local_218;
  longlong lStack_210;
  int32_t local_208;
  int32_t local_204;
  int32_t local_200;
  int32_t local_1fc;
  longlong local_1f8;
  longlong lStack_1f0;
  int32_t local_1e8;
  int32_t local_1e4;
  int32_t local_1e0;
  int32_t local_1dc;
  longlong local_1d8;
  longlong lStack_1d0;
  int32_t local_1c8;
  int32_t local_1c4;
  int32_t local_1c0;
  int32_t local_1bc;
  longlong local_1b8;
  longlong lStack_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  longlong local_178;
  longlong lStack_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  longlong local_138;
  longlong lStack_130;
  int32_t local_128;
  int32_t local_124;
  int32_t local_120;
  int32_t local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  longlong local_f8;
  longlong lStack_f0;
  int32_t local_e8;
  int32_t local_e4;
  int32_t local_e0;
  int32_t local_dc;
  longlong local_d8;
  longlong lStack_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  longlong local_b8;
  longlong lStack_b0;
  int32_t local_a8;
  int32_t local_a4;
  int32_t local_a0;
  int32_t local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  longlong local_78;
  longlong lStack_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  longlong local_58;
  longlong lStack_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  longlong local_38;
  longlong lStack_30;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_5fc = (int)in_R8;
  local_600 = SUB84(in_R9,0);
  local_5f8 = in_ECX;
  local_5f4 = in_EDX;
  local_5e8 = in_RDI;
  local_608 = cospi_arr(in_EDX);
  local_53c = local_608[0x3e];
  local_618 = CONCAT44(local_53c,local_53c);
  lStack_610 = CONCAT44(local_53c,local_53c);
  local_540 = local_608[0x1e];
  local_628 = CONCAT44(local_540,local_540);
  lStack_620 = CONCAT44(local_540,local_540);
  local_544 = local_608[0x2e];
  local_638 = CONCAT44(local_544,local_544);
  lStack_630 = CONCAT44(local_544,local_544);
  local_548 = local_608[0xe];
  local_648 = CONCAT44(local_548,local_548);
  lStack_640 = CONCAT44(local_548,local_548);
  local_54c = local_608[0x36];
  local_658 = CONCAT44(local_54c,local_54c);
  lStack_650 = CONCAT44(local_54c,local_54c);
  local_550 = local_608[0x16];
  local_668 = CONCAT44(local_550,local_550);
  lStack_660 = CONCAT44(local_550,local_550);
  local_554 = local_608[0x26];
  local_678 = CONCAT44(local_554,local_554);
  lStack_670 = CONCAT44(local_554,local_554);
  local_558 = local_608[6];
  local_688 = CONCAT44(local_558,local_558);
  lStack_680 = CONCAT44(local_558,local_558);
  local_55c = local_608[0x1a];
  local_698 = CONCAT44(local_55c,local_55c);
  lStack_690 = CONCAT44(local_55c,local_55c);
  local_560 = local_608[10];
  local_6a8 = CONCAT44(local_560,local_560);
  lStack_6a0 = CONCAT44(local_560,local_560);
  local_564 = local_608[0x12];
  local_6b8 = CONCAT44(local_564,local_564);
  lStack_6b0 = CONCAT44(local_564,local_564);
  local_568 = local_608[2];
  local_6c8 = CONCAT44(local_568,local_568);
  lStack_6c0 = CONCAT44(local_568,local_568);
  local_56c = -local_608[0x3a];
  local_6d8 = CONCAT44(local_56c,local_56c);
  lStack_6d0 = CONCAT44(local_56c,local_56c);
  local_570 = -local_608[0x2a];
  local_6e8 = CONCAT44(local_570,local_570);
  lStack_6e0 = CONCAT44(local_570,local_570);
  local_574 = -local_608[0x32];
  local_6f8 = CONCAT44(local_574,local_574);
  lStack_6f0 = CONCAT44(local_574,local_574);
  local_578 = -local_608[0x22];
  local_708 = CONCAT44(local_578,local_578);
  lStack_700 = CONCAT44(local_578,local_578);
  local_57c = local_608[0x3c];
  local_718 = CONCAT44(local_57c,local_57c);
  lStack_710 = CONCAT44(local_57c,local_57c);
  local_580 = local_608[0x1c];
  local_728 = CONCAT44(local_580,local_580);
  lStack_720 = CONCAT44(local_580,local_580);
  local_584 = local_608[0x2c];
  local_738 = CONCAT44(local_584,local_584);
  lStack_730 = CONCAT44(local_584,local_584);
  local_588 = local_608[0xc];
  local_748 = CONCAT44(local_588,local_588);
  lStack_740 = CONCAT44(local_588,local_588);
  local_58c = local_608[0x14];
  local_758 = CONCAT44(local_58c,local_58c);
  lStack_750 = CONCAT44(local_58c,local_58c);
  local_590 = local_608[4];
  local_768 = CONCAT44(local_590,local_590);
  lStack_760 = CONCAT44(local_590,local_590);
  local_594 = -local_608[0x34];
  local_778 = CONCAT44(local_594,local_594);
  lStack_770 = CONCAT44(local_594,local_594);
  local_598 = -local_608[0x24];
  local_788 = CONCAT44(local_598,local_598);
  lStack_780 = CONCAT44(local_598,local_598);
  local_59c = local_608[0x38];
  local_798 = CONCAT44(local_59c,local_59c);
  lStack_790 = CONCAT44(local_59c,local_59c);
  local_5a0 = local_608[0x18];
  local_7a8 = CONCAT44(local_5a0,local_5a0);
  lStack_7a0 = CONCAT44(local_5a0,local_5a0);
  local_5a4 = local_608[0x28];
  local_7b8 = CONCAT44(local_5a4,local_5a4);
  lStack_7b0 = CONCAT44(local_5a4,local_5a4);
  local_5a8 = local_608[8];
  local_7c8 = CONCAT44(local_5a8,local_5a8);
  lStack_7c0 = CONCAT44(local_5a8,local_5a8);
  local_5ac = -local_608[0x28];
  local_7d8 = CONCAT44(local_5ac,local_5ac);
  lStack_7d0 = CONCAT44(local_5ac,local_5ac);
  local_5b0 = -local_608[8];
  local_7e8 = CONCAT44(local_5b0,local_5b0);
  uStack_7e0 = CONCAT44(local_5b0,local_5b0);
  local_5b4 = -local_608[0x38];
  local_7f8 = CONCAT44(local_5b4,local_5b4);
  lStack_7f0 = CONCAT44(local_5b4,local_5b4);
  local_5b8 = -local_608[0x18];
  local_808 = CONCAT44(local_5b8,local_5b8);
  uStack_800 = CONCAT44(local_5b8,local_5b8);
  local_5bc = local_608[0x20];
  local_818 = CONCAT44(local_5bc,local_5bc);
  lStack_810 = CONCAT44(local_5bc,local_5bc);
  local_5c0 = -local_608[0x20];
  local_828 = CONCAT44(local_5c0,local_5c0);
  uStack_820 = CONCAT44(local_5c0,local_5c0);
  local_5c4 = local_608[0x30];
  local_838 = CONCAT44(local_5c4,local_5c4);
  lStack_830 = CONCAT44(local_5c4,local_5c4);
  local_5c8 = -local_608[0x30];
  local_848 = CONCAT44(local_5c8,local_5c8);
  lStack_840 = CONCAT44(local_5c8,local_5c8);
  local_5cc = local_608[0x10];
  local_858 = CONCAT44(local_5cc,local_5cc);
  lStack_850 = CONCAT44(local_5cc,local_5cc);
  local_5d0 = -local_608[0x10];
  local_868 = CONCAT44(local_5d0,local_5d0);
  uStack_860 = CONCAT44(local_5d0,local_5d0);
  local_5d4 = 1 << ((char)local_5f4 - 1U & 0x1f);
  local_878 = CONCAT44(local_5d4,local_5d4);
  lStack_870 = CONCAT44(local_5d4,local_5d4);
  iVar6 = 8;
  if (local_5f8 != 0) {
    iVar6 = 6;
  }
  if (local_5fc + iVar6 < 0x10) {
    iVar6 = 0x10;
  }
  else {
    iVar6 = 8;
    if (local_5f8 != 0) {
      iVar6 = 6;
    }
    iVar6 = local_5fc + iVar6;
  }
  local_87c._0_1_ = (char)iVar6;
  local_5d8 = -(1 << ((char)local_87c - 1U & 0x1f));
  local_898 = CONCAT44(local_5d8,local_5d8);
  lStack_890 = CONCAT44(local_5d8,local_5d8);
  local_5dc = (1 << ((char)local_87c - 1U & 0x1f)) + -1;
  local_8a8 = CONCAT44(local_5dc,local_5dc);
  lStack_8a0 = CONCAT44(local_5dc,local_5dc);
  palVar7 = (__m128i *)*local_5e8;
  palVar8 = (__m128i *)local_5e8[1];
  palVar9 = (__m128i *)local_5e8[0x11];
  local_a48 = local_5e8[0x18];
  lStack_a40 = local_5e8[0x19];
  local_a28 = local_5e8[4];
  local_a08 = local_5e8[0x14];
  lStack_a00 = local_5e8[0x15];
  local_9e8 = local_5e8[0xc];
  lStack_9e0 = local_5e8[0xd];
  local_9c8 = local_5e8[0x1c];
  lStack_9c0 = local_5e8[0x1d];
  local_9a8 = local_5e8[2];
  lStack_9a0 = local_5e8[3];
  local_988 = local_5e8[0x12];
  lStack_980 = local_5e8[0x13];
  local_968 = local_5e8[10];
  lStack_960 = local_5e8[0xb];
  local_948 = local_5e8[0x1a];
  lStack_940 = local_5e8[0x1b];
  local_928 = local_5e8[6];
  lStack_920 = local_5e8[7];
  local_908 = local_5e8[0x16];
  lStack_900 = local_5e8[0x17];
  local_8e8 = local_5e8[0xe];
  lStack_8e0 = local_5e8[0xf];
  local_8c8 = local_5e8[0x1e];
  lStack_8c0 = local_5e8[0x1f];
  local_87c = iVar6;
  local_538 = local_618;
  lStack_530 = lStack_610;
  local_528 = local_53c;
  local_524 = local_53c;
  local_520 = local_53c;
  local_51c = local_53c;
  local_518 = local_628;
  lStack_510 = lStack_620;
  local_508 = local_540;
  local_504 = local_540;
  local_500 = local_540;
  local_4fc = local_540;
  local_4f8 = local_638;
  lStack_4f0 = lStack_630;
  local_4e8 = local_544;
  local_4e4 = local_544;
  local_4e0 = local_544;
  local_4dc = local_544;
  local_4d8 = local_648;
  lStack_4d0 = lStack_640;
  local_4c8 = local_548;
  local_4c4 = local_548;
  local_4c0 = local_548;
  local_4bc = local_548;
  local_4b8 = local_658;
  lStack_4b0 = lStack_650;
  local_4a8 = local_54c;
  local_4a4 = local_54c;
  local_4a0 = local_54c;
  local_49c = local_54c;
  local_498 = local_668;
  lStack_490 = lStack_660;
  local_488 = local_550;
  local_484 = local_550;
  local_480 = local_550;
  local_47c = local_550;
  local_478 = local_678;
  lStack_470 = lStack_670;
  local_468 = local_554;
  local_464 = local_554;
  local_460 = local_554;
  local_45c = local_554;
  local_458 = local_688;
  lStack_450 = lStack_680;
  local_448 = local_558;
  local_444 = local_558;
  local_440 = local_558;
  local_43c = local_558;
  local_438 = local_698;
  lStack_430 = lStack_690;
  local_428 = local_55c;
  local_424 = local_55c;
  local_420 = local_55c;
  local_41c = local_55c;
  local_418 = local_6a8;
  lStack_410 = lStack_6a0;
  local_408 = local_560;
  local_404 = local_560;
  local_400 = local_560;
  local_3fc = local_560;
  local_3f8 = local_6b8;
  lStack_3f0 = lStack_6b0;
  local_3e8 = local_564;
  local_3e4 = local_564;
  local_3e0 = local_564;
  local_3dc = local_564;
  local_3d8 = local_6c8;
  lStack_3d0 = lStack_6c0;
  local_3c8 = local_568;
  local_3c4 = local_568;
  local_3c0 = local_568;
  local_3bc = local_568;
  local_3b8 = local_6d8;
  lStack_3b0 = lStack_6d0;
  local_3a8 = local_56c;
  local_3a4 = local_56c;
  local_3a0 = local_56c;
  local_39c = local_56c;
  local_398 = local_6e8;
  lStack_390 = lStack_6e0;
  local_388 = local_570;
  local_384 = local_570;
  local_380 = local_570;
  local_37c = local_570;
  local_378 = local_6f8;
  lStack_370 = lStack_6f0;
  local_368 = local_574;
  local_364 = local_574;
  local_360 = local_574;
  local_35c = local_574;
  local_358 = local_708;
  lStack_350 = lStack_700;
  local_348 = local_578;
  local_344 = local_578;
  local_340 = local_578;
  local_33c = local_578;
  local_338 = local_718;
  lStack_330 = lStack_710;
  local_328 = local_57c;
  local_324 = local_57c;
  local_320 = local_57c;
  local_31c = local_57c;
  local_318 = local_728;
  lStack_310 = lStack_720;
  local_308 = local_580;
  local_304 = local_580;
  local_300 = local_580;
  local_2fc = local_580;
  local_2f8 = local_738;
  lStack_2f0 = lStack_730;
  local_2e8 = local_584;
  local_2e4 = local_584;
  local_2e0 = local_584;
  local_2dc = local_584;
  local_2d8 = local_748;
  lStack_2d0 = lStack_740;
  local_2c8 = local_588;
  local_2c4 = local_588;
  local_2c0 = local_588;
  local_2bc = local_588;
  local_2b8 = local_758;
  lStack_2b0 = lStack_750;
  local_2a8 = local_58c;
  local_2a4 = local_58c;
  local_2a0 = local_58c;
  local_29c = local_58c;
  local_298 = local_768;
  lStack_290 = lStack_760;
  local_288 = local_590;
  local_284 = local_590;
  local_280 = local_590;
  local_27c = local_590;
  local_278 = local_778;
  lStack_270 = lStack_770;
  local_268 = local_594;
  local_264 = local_594;
  local_260 = local_594;
  local_25c = local_594;
  local_258 = local_788;
  lStack_250 = lStack_780;
  local_248 = local_598;
  local_244 = local_598;
  local_240 = local_598;
  local_23c = local_598;
  local_238 = local_798;
  lStack_230 = lStack_790;
  local_228 = local_59c;
  local_224 = local_59c;
  local_220 = local_59c;
  local_21c = local_59c;
  local_218 = local_7a8;
  lStack_210 = lStack_7a0;
  local_208 = local_5a0;
  local_204 = local_5a0;
  local_200 = local_5a0;
  local_1fc = local_5a0;
  local_1f8 = local_7b8;
  lStack_1f0 = lStack_7b0;
  local_1e8 = local_5a4;
  local_1e4 = local_5a4;
  local_1e0 = local_5a4;
  local_1dc = local_5a4;
  local_1d8 = local_7c8;
  lStack_1d0 = lStack_7c0;
  local_1c8 = local_5a8;
  local_1c4 = local_5a8;
  local_1c0 = local_5a8;
  local_1bc = local_5a8;
  local_1b8 = local_7d8;
  lStack_1b0 = lStack_7d0;
  local_1a8 = local_5ac;
  local_1a4 = local_5ac;
  local_1a0 = local_5ac;
  local_19c = local_5ac;
  local_198 = local_7e8;
  uStack_190 = uStack_7e0;
  local_188 = local_5b0;
  local_184 = local_5b0;
  local_180 = local_5b0;
  local_17c = local_5b0;
  local_178 = local_7f8;
  lStack_170 = lStack_7f0;
  local_168 = local_5b4;
  local_164 = local_5b4;
  local_160 = local_5b4;
  local_15c = local_5b4;
  local_158 = local_808;
  uStack_150 = uStack_800;
  local_148 = local_5b8;
  local_144 = local_5b8;
  local_140 = local_5b8;
  local_13c = local_5b8;
  local_138 = local_818;
  lStack_130 = lStack_810;
  local_128 = local_5bc;
  local_124 = local_5bc;
  local_120 = local_5bc;
  local_11c = local_5bc;
  local_118 = local_828;
  uStack_110 = uStack_820;
  local_108 = local_5c0;
  local_104 = local_5c0;
  local_100 = local_5c0;
  local_fc = local_5c0;
  local_f8 = local_838;
  lStack_f0 = lStack_830;
  local_e8 = local_5c4;
  local_e4 = local_5c4;
  local_e0 = local_5c4;
  local_dc = local_5c4;
  local_d8 = local_848;
  lStack_d0 = lStack_840;
  local_c8 = local_5c8;
  local_c4 = local_5c8;
  local_c0 = local_5c8;
  local_bc = local_5c8;
  local_b8 = local_858;
  lStack_b0 = lStack_850;
  local_a8 = local_5cc;
  local_a4 = local_5cc;
  local_a0 = local_5cc;
  local_9c = local_5cc;
  local_98 = local_868;
  uStack_90 = uStack_860;
  local_88 = local_5d0;
  local_84 = local_5d0;
  local_80 = local_5d0;
  local_7c = local_5d0;
  local_78 = local_878;
  lStack_70 = lStack_870;
  local_68 = local_5d4;
  local_64 = local_5d4;
  local_60 = local_5d4;
  local_5c = local_5d4;
  local_58 = local_898;
  lStack_50 = lStack_890;
  local_48 = local_5d8;
  local_44 = local_5d8;
  local_40 = local_5d8;
  local_3c = local_5d8;
  local_38 = local_8a8;
  lStack_30 = lStack_8a0;
  local_20 = local_5dc;
  local_1c = local_5dc;
  local_18 = local_5dc;
  local_14 = local_5dc;
  half_btf_0_sse4_1((__m128i *)&local_6c8,(__m128i *)&local_9a8,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_618,(__m128i *)&local_9a8,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_708,(__m128i *)&local_8c8,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_628,(__m128i *)&local_8c8,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_6b8,(__m128i *)&local_988,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_638,(__m128i *)&local_988,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_6f8,(__m128i *)&local_8e8,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_648,(__m128i *)&local_8e8,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_6a8,(__m128i *)&local_968,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_658,(__m128i *)&local_968,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_6e8,(__m128i *)&local_908,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_668,(__m128i *)&local_908,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_698,(__m128i *)&local_948,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_678,(__m128i *)&local_948,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_6d8,(__m128i *)&local_928,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_688,(__m128i *)&local_928,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_768,(__m128i *)&local_a28,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_718,(__m128i *)&local_a28,(__m128i *)&local_878,local_5f4);
  clamp_hi_02 = extraout_XMM0_Qb;
  half_btf_0_sse4_1((__m128i *)&local_788,(__m128i *)&local_9c8,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_728,(__m128i *)&local_9c8,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_758,(__m128i *)&local_a08,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_738,(__m128i *)&local_a08,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_778,(__m128i *)&local_9e8,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_748,(__m128i *)&local_9e8,(__m128i *)&local_878,local_5f4);
  in0[0] = &local_9a8;
  in0[1] = local_998;
  in1[1] = (longlong)&local_8a8;
  in1[0] = (longlong)&local_898;
  addsub_sse4_1(in0,in1,in_R8,in_R9,in_stack_fffffffffffff528,in_stack_fffffffffffff530);
  in0_00[0] = local_978;
  in0_00[1] = &local_988;
  in1_00[1] = (longlong)&local_8a8;
  in1_00[0] = (longlong)&local_898;
  addsub_sse4_1(in0_00,in1_00,in_R8,in_R9,in_stack_fffffffffffff528,in_stack_fffffffffffff530);
  in0_01[0] = &local_968;
  in0_01[1] = local_958;
  in1_01[1] = (longlong)&local_8a8;
  in1_01[0] = (longlong)&local_898;
  addsub_sse4_1(in0_01,in1_01,in_R8,in_R9,in_stack_fffffffffffff528,in_stack_fffffffffffff530);
  in0_02[0] = local_938;
  in0_02[1] = &local_948;
  in1_02[1] = (longlong)&local_8a8;
  in1_02[0] = (longlong)&local_898;
  addsub_sse4_1(in0_02,in1_02,in_R8,in_R9,in_stack_fffffffffffff528,in_stack_fffffffffffff530);
  in0_03[0] = &local_928;
  in0_03[1] = local_918;
  in1_03[1] = (longlong)&local_8a8;
  in1_03[0] = (longlong)&local_898;
  addsub_sse4_1(in0_03,in1_03,in_R8,in_R9,in_stack_fffffffffffff528,in_stack_fffffffffffff530);
  in0_04[0] = local_8f8;
  in0_04[1] = &local_908;
  in1_04[1] = (longlong)&local_8a8;
  in1_04[0] = (longlong)&local_898;
  addsub_sse4_1(in0_04,in1_04,in_R8,in_R9,in_stack_fffffffffffff528,in_stack_fffffffffffff530);
  in0_05[0] = &local_8e8;
  in0_05[1] = local_8d8;
  in1_05[1] = (longlong)&local_8a8;
  in1_05[0] = (longlong)&local_898;
  addsub_sse4_1(in0_05,in1_05,in_R8,in_R9,in_stack_fffffffffffff528,in_stack_fffffffffffff530);
  in0_06[0] = local_8b8;
  in0_06[1] = &local_8c8;
  in1_06[1] = (longlong)&local_8a8;
  in1_06[0] = (longlong)&local_898;
  addsub_sse4_1(in0_06,in1_06,in_R8,in_R9,in_stack_fffffffffffff528,in_stack_fffffffffffff530);
  half_btf_0_sse4_1((__m128i *)&local_7c8,(__m128i *)&stack0xfffffffffffff598,(__m128i *)&local_878,
                    local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_798,(__m128i *)&stack0xfffffffffffff598,(__m128i *)&local_878,
                    local_5f4);
  rounding_01 = extraout_XMM0_Qa;
  bit_00 = extraout_XMM0_Dc;
  half_btf_0_sse4_1((__m128i *)&local_7d8,(__m128i *)&local_a48,(__m128i *)&local_878,local_5f4);
  half_btf_0_sse4_1((__m128i *)&local_7a8,(__m128i *)&local_a48,(__m128i *)&local_878,local_5f4);
  in0_07[0] = &local_a28;
  in0_07[1] = local_a18;
  in1_07[1] = (longlong)&local_8a8;
  in1_07[0] = (longlong)&local_898;
  addsub_sse4_1(in0_07,in1_07,in_R8,in_R9,in_stack_fffffffffffff528,in_stack_fffffffffffff530);
  in0_08[0] = local_9f8;
  in0_08[1] = &local_a08;
  in1_08[1] = (longlong)&local_8a8;
  in1_08[0] = (longlong)&local_898;
  addsub_sse4_1(in0_08,in1_08,in_R8,in_R9,in_stack_fffffffffffff528,in_stack_fffffffffffff530);
  in0_09[0] = &local_9e8;
  in0_09[1] = local_9d8;
  in1_09[1] = (longlong)&local_8a8;
  in1_09[0] = (longlong)&local_898;
  addsub_sse4_1(in0_09,in1_09,in_R8,in_R9,in_stack_fffffffffffff528,in_stack_fffffffffffff530);
  in0_10[0] = local_9b8;
  in0_10[1] = &local_9c8;
  in1_10[1] = (longlong)&local_8a8;
  in1_10[0] = (longlong)&local_898;
  addsub_sse4_1(in0_10,in1_10,in_R8,in_R9,in_stack_fffffffffffff528,in_stack_fffffffffffff530);
  palVar1 = (__m128i *)&local_7f8;
  palVar2 = (__m128i *)&local_7d8;
  palVar3 = (__m128i *)&local_7a8;
  palVar4 = (__m128i *)&local_7b8;
  iVar5 = local_5f4;
  idct32_stage4_sse4_1
            (in_stack_fffffffffffff570,in_stack_fffffffffffff568,palVar8,palVar7,
             (__m128i *)CONCAT44(iVar6,in_stack_fffffffffffff550),
             (__m128i *)CONCAT44(in_stack_fffffffffffff54c,local_5f4),palVar9,
             in_stack_fffffffffffff588,in_stack_fffffffffffff590,rounding_01,bit_00);
  half_btf_0_sse4_1((__m128i *)&local_818,(__m128i *)&stack0xfffffffffffff558,(__m128i *)&local_878,
                    local_5f4);
  palVar7 = extraout_XMM0_Qa_00;
  palVar8 = extraout_XMM0_Qb_00;
  palVar9 = extraout_XMM0_Qa_00;
  bf1_00 = extraout_XMM0_Qb_00;
  half_btf_0_sse4_1((__m128i *)&local_858,(__m128i *)&stack0xfffffffffffff578,(__m128i *)&local_878,
                    local_5f4);
  rounding_00 = extraout_XMM0_Qa_01;
  clamp_hi_01 = extraout_XMM0_Qb_01;
  half_btf_0_sse4_1((__m128i *)&local_838,(__m128i *)&stack0xfffffffffffff578,(__m128i *)&local_878,
                    local_5f4);
  in0_11[0] = &stack0xfffffffffffff598;
  in0_11[1] = local_a58;
  in1_11[1] = (longlong)&local_8a8;
  in1_11[0] = (longlong)&local_898;
  out_00 = extraout_XMM0_Qa_02;
  clamp_hi_00 = extraout_XMM0_Qb_02;
  addsub_sse4_1(in0_11,in1_11,palVar1,palVar2,palVar3,palVar4);
  in0_12[0] = local_a38;
  in0_12[1] = &local_a48;
  in1_12[1] = (longlong)&local_8a8;
  in1_12[0] = (longlong)&local_898;
  addsub_sse4_1(in0_12,in1_12,palVar1,palVar2,palVar3,palVar4);
  palVar1 = (__m128i *)&local_848;
  palVar2 = (__m128i *)&local_898;
  palVar3 = (__m128i *)&local_8a8;
  palVar4 = (__m128i *)&local_878;
  idct32_stage5_sse4_1
            (bf1_00,palVar9,palVar8,palVar7,(__m128i *)CONCAT44(iVar6,in_stack_fffffffffffff550),
             (__m128i *)CONCAT44(in_stack_fffffffffffff54c,iVar5),clamp_hi_00,rounding_00,
             (int)clamp_hi_01);
  in0_13[1] = &stack0xfffffffffffff588;
  in1_13[1] = (longlong)&local_8a8;
  in1_13[0] = (longlong)&local_898;
  in0_13[0] = (longlong)&stack0xfffffffffffff558;
  addsub_sse4_1(in0_13,in1_13,palVar1,palVar2,palVar3,palVar4);
  in0_14[0] = &stack0xfffffffffffff568;
  in0_14[1] = &stack0xfffffffffffff578;
  in1_14[1] = (longlong)&local_8a8;
  in1_14[0] = (longlong)&local_898;
  addsub_sse4_1(in0_14,in1_14,palVar1,palVar2,palVar3,palVar4);
  idct32_stage6_sse4_1
            (bf1_00,palVar9,palVar8,palVar7,(__m128i *)CONCAT44(iVar6,in_stack_fffffffffffff550),
             (__m128i *)CONCAT44(in_stack_fffffffffffff54c,local_5f4),clamp_hi_00,rounding_00,
             clamp_hi_01,rounding_01,bit_00);
  idct32_stage7_sse4_1
            (bf1_00,palVar9,palVar8,palVar7,(__m128i *)CONCAT44(iVar6,in_stack_fffffffffffff550),
             (__m128i *)CONCAT44(in_stack_fffffffffffff54c,local_5f4),(int)clamp_hi_00);
  idct32_stage8_sse4_1
            (bf1_00,palVar9,palVar8,palVar7,(__m128i *)CONCAT44(iVar6,in_stack_fffffffffffff550),
             (__m128i *)CONCAT44(in_stack_fffffffffffff54c,local_5f4),(int)clamp_hi_00);
  idct32_stage9_sse4_1
            (clamp_hi_00,out_00,(int)((ulong)bf1_00 >> 0x20),(int)bf1_00,
             (int)((ulong)palVar9 >> 0x20),palVar8,clamp_hi_02);
  return;
}

Assistant:

static void idct32x32_low16_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi30 = _mm_set1_epi32(cospi[30]);
  const __m128i cospi46 = _mm_set1_epi32(cospi[46]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi22 = _mm_set1_epi32(cospi[22]);
  const __m128i cospi38 = _mm_set1_epi32(cospi[38]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi26 = _mm_set1_epi32(cospi[26]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi18 = _mm_set1_epi32(cospi[18]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospim42 = _mm_set1_epi32(-cospi[42]);
  const __m128i cospim50 = _mm_set1_epi32(-cospi[50]);
  const __m128i cospim34 = _mm_set1_epi32(-cospi[34]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i rounding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i bf1[32];

  // stage 0
  // stage 1

  bf1[0] = in[0];
  bf1[2] = in[8];
  bf1[4] = in[4];
  bf1[6] = in[12];
  bf1[8] = in[2];
  bf1[10] = in[10];
  bf1[12] = in[6];
  bf1[14] = in[14];
  bf1[16] = in[1];
  bf1[18] = in[9];
  bf1[20] = in[5];
  bf1[22] = in[13];
  bf1[24] = in[3];
  bf1[26] = in[11];
  bf1[28] = in[7];
  bf1[30] = in[15];

  // stage 2
  bf1[31] = half_btf_0_sse4_1(&cospi2, &bf1[16], &rounding, bit);
  bf1[16] = half_btf_0_sse4_1(&cospi62, &bf1[16], &rounding, bit);
  bf1[17] = half_btf_0_sse4_1(&cospim34, &bf1[30], &rounding, bit);
  bf1[30] = half_btf_0_sse4_1(&cospi30, &bf1[30], &rounding, bit);
  bf1[29] = half_btf_0_sse4_1(&cospi18, &bf1[18], &rounding, bit);
  bf1[18] = half_btf_0_sse4_1(&cospi46, &bf1[18], &rounding, bit);
  bf1[19] = half_btf_0_sse4_1(&cospim50, &bf1[28], &rounding, bit);
  bf1[28] = half_btf_0_sse4_1(&cospi14, &bf1[28], &rounding, bit);
  bf1[27] = half_btf_0_sse4_1(&cospi10, &bf1[20], &rounding, bit);
  bf1[20] = half_btf_0_sse4_1(&cospi54, &bf1[20], &rounding, bit);
  bf1[21] = half_btf_0_sse4_1(&cospim42, &bf1[26], &rounding, bit);
  bf1[26] = half_btf_0_sse4_1(&cospi22, &bf1[26], &rounding, bit);
  bf1[25] = half_btf_0_sse4_1(&cospi26, &bf1[22], &rounding, bit);
  bf1[22] = half_btf_0_sse4_1(&cospi38, &bf1[22], &rounding, bit);
  bf1[23] = half_btf_0_sse4_1(&cospim58, &bf1[24], &rounding, bit);
  bf1[24] = half_btf_0_sse4_1(&cospi6, &bf1[24], &rounding, bit);

  // stage 3
  bf1[15] = half_btf_0_sse4_1(&cospi4, &bf1[8], &rounding, bit);
  bf1[8] = half_btf_0_sse4_1(&cospi60, &bf1[8], &rounding, bit);
  bf1[9] = half_btf_0_sse4_1(&cospim36, &bf1[14], &rounding, bit);
  bf1[14] = half_btf_0_sse4_1(&cospi28, &bf1[14], &rounding, bit);
  bf1[13] = half_btf_0_sse4_1(&cospi20, &bf1[10], &rounding, bit);
  bf1[10] = half_btf_0_sse4_1(&cospi44, &bf1[10], &rounding, bit);
  bf1[11] = half_btf_0_sse4_1(&cospim52, &bf1[12], &rounding, bit);
  bf1[12] = half_btf_0_sse4_1(&cospi12, &bf1[12], &rounding, bit);

  addsub_sse4_1(bf1[16], bf1[17], bf1 + 16, bf1 + 17, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[19], bf1[18], bf1 + 19, bf1 + 18, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[20], bf1[21], bf1 + 20, bf1 + 21, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[23], bf1[22], bf1 + 23, bf1 + 22, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[24], bf1[25], bf1 + 24, bf1 + 25, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[27], bf1[26], bf1 + 27, bf1 + 26, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[28], bf1[29], bf1 + 28, bf1 + 29, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[31], bf1[30], bf1 + 31, bf1 + 30, &clamp_lo, &clamp_hi);
  // stage 4
  bf1[7] = half_btf_0_sse4_1(&cospi8, &bf1[4], &rounding, bit);
  bf1[4] = half_btf_0_sse4_1(&cospi56, &bf1[4], &rounding, bit);
  bf1[5] = half_btf_0_sse4_1(&cospim40, &bf1[6], &rounding, bit);
  bf1[6] = half_btf_0_sse4_1(&cospi24, &bf1[6], &rounding, bit);

  addsub_sse4_1(bf1[8], bf1[9], bf1 + 8, bf1 + 9, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[11], bf1[10], bf1 + 11, bf1 + 10, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[12], bf1[13], bf1 + 12, bf1 + 13, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[15], bf1[14], bf1 + 15, bf1 + 14, &clamp_lo, &clamp_hi);

  idct32_stage4_sse4_1(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

  // stage 5
  bf1[0] = half_btf_0_sse4_1(&cospi32, &bf1[0], &rounding, bit);
  bf1[1] = bf1[0];
  bf1[3] = half_btf_0_sse4_1(&cospi16, &bf1[2], &rounding, bit);
  bf1[2] = half_btf_0_sse4_1(&cospi48, &bf1[2], &rounding, bit);

  addsub_sse4_1(bf1[4], bf1[5], bf1 + 4, bf1 + 5, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[7], bf1[6], bf1 + 7, bf1 + 6, &clamp_lo, &clamp_hi);

  idct32_stage5_sse4_1(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

  // stage 6
  addsub_sse4_1(bf1[0], bf1[3], bf1 + 0, bf1 + 3, &clamp_lo, &clamp_hi);
  addsub_sse4_1(bf1[1], bf1[2], bf1 + 1, bf1 + 2, &clamp_lo, &clamp_hi);

  idct32_stage6_sse4_1(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

  // stage 7
  idct32_stage7_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

  // stage 8
  idct32_stage8_sse4_1(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);
  // stage 9
  idct32_stage9_sse4_1(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
}